

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O0

void * tdefl_compress_mem_to_heap(void *pSrc_buf,size_t src_buf_len,size_t *pOut_len,int flags)

{
  mz_bool mVar1;
  size_t local_50;
  tdefl_output_buffer out_buf;
  int flags_local;
  size_t *pOut_len_local;
  size_t src_buf_len_local;
  void *pSrc_buf_local;
  
  out_buf._28_4_ = flags;
  memset(&local_50,0,0x20);
  if (pOut_len == (size_t *)0x0) {
    pSrc_buf_local = (void *)0x0;
  }
  else {
    *pOut_len = 0;
    out_buf.m_pBuf._0_4_ = 1;
    mVar1 = tdefl_compress_mem_to_output
                      (pSrc_buf,src_buf_len,tdefl_output_buffer_putter,&local_50,out_buf._28_4_);
    if (mVar1 == 0) {
      pSrc_buf_local = (void *)0x0;
    }
    else {
      *pOut_len = local_50;
      pSrc_buf_local = (void *)out_buf.m_capacity;
    }
  }
  return pSrc_buf_local;
}

Assistant:

void *tdefl_compress_mem_to_heap(const void *pSrc_buf, size_t src_buf_len, size_t *pOut_len, int flags)
{
    tdefl_output_buffer out_buf;
    MZ_CLEAR_OBJ(out_buf);
    if (!pOut_len)
        return MZ_FALSE;
    else
        *pOut_len = 0;
    out_buf.m_expandable = MZ_TRUE;
    if (!tdefl_compress_mem_to_output(pSrc_buf, src_buf_len, tdefl_output_buffer_putter, &out_buf, flags))
        return NULL;
    *pOut_len = out_buf.m_size;
    return out_buf.m_pBuf;
}